

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::EntryPointInfo::SetCodeGenDone(EntryPointInfo *this)

{
  byte *pbVar1;
  code *pcVar2;
  State SVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  
  SVar3 = GetState(this);
  if (SVar3 != CodeGenRecorded) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x207e,"(this->GetState() == CodeGenRecorded)",
                                "this->GetState() == CodeGenRecorded");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this->state = CodeGenDone;
  (this->workItem).ptr = (CodeGenWorkItem *)0x0;
  if ((this->field_0x18 & 2) != 0) {
    iVar5 = (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
    pbVar1 = (byte *)(CONCAT44(extraout_var,iVar5) + 0x178);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void EntryPointInfo::SetCodeGenDone()
    {
        Assert(this->GetState() == CodeGenRecorded);
        this->state = CodeGenDone;
        this->workItem = nullptr;
        if (this->IsLoopBody())
        {
            this->GetFunctionBody()->SetHasDoneLoopBodyCodeGen(true);
        }
    }